

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigOutDec.c
# Opt level: O1

Aig_Man_t * Saig_ManDecPropertyOutput(Aig_Man_t *pAig,int nLits,int fVerbose)

{
  char *__s;
  void *pvVar1;
  void **ppvVar2;
  uint uVar3;
  Vec_Ptr_t *__ptr;
  Aig_Man_t *p;
  size_t sVar4;
  char *__dest;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  ulong uVar8;
  void *pvVar9;
  Aig_Obj_t *p1;
  long lVar10;
  int iVar11;
  long lVar12;
  
  __ptr = Saig_ManFindPrimes(pAig,nLits,fVerbose);
  p = Aig_ManStart(pAig->nObjs[6] + pAig->nObjs[5]);
  __s = pAig->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar4 = strlen(__s);
    __dest = (char *)malloc(sVar4 + 1);
    strcpy(__dest,__s);
  }
  p->pName = __dest;
  p->nConstrs = pAig->nConstrs;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  pVVar6 = pAig->vCis;
  if (0 < pVVar6->nSize) {
    lVar12 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar12];
      pAVar5 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
      lVar12 = lVar12 + 1;
      pVVar6 = pAig->vCis;
    } while (lVar12 < pVVar6->nSize);
  }
  pVVar6 = pAig->vObjs;
  if (0 < pVVar6->nSize) {
    lVar12 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar12];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_0065d56b;
        uVar7 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          pAVar5 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar5 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        uVar7 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        pAVar5 = Aig_And(p,pAVar5,p1);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
      }
      lVar12 = lVar12 + 1;
      pVVar6 = pAig->vObjs;
    } while (lVar12 < pVVar6->nSize);
  }
  if (0 < pAig->nTruePos) {
    lVar12 = 0;
    do {
      if (pAig->vCos->nSize <= lVar12) goto LAB_0065d54c;
      pvVar1 = pAig->vCos->pArray[lVar12];
      if (((ulong)pvVar1 & 1) != 0) goto LAB_0065d56b;
      uVar7 = *(ulong *)((long)pvVar1 + 8);
      uVar8 = uVar7 & 0xfffffffffffffffe;
      if (uVar8 == 0) {
        pAVar5 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar5 = (Aig_Obj_t *)((ulong)((uint)uVar7 & 1) ^ *(ulong *)(uVar8 + 0x28));
      }
      Aig_ObjCreateCo(p,pAVar5);
      lVar12 = lVar12 + 1;
    } while (lVar12 < pAig->nTruePos);
  }
  if ((__ptr != (Vec_Ptr_t *)0x0) && (0 < __ptr->nSize)) {
    lVar12 = 0;
    do {
      pvVar1 = __ptr->pArray[lVar12];
      pAVar5 = p->pConst1;
      if (0 < *(int *)((long)pvVar1 + 4)) {
        lVar10 = 0;
        do {
          uVar3 = *(uint *)(*(long *)((long)pvVar1 + 8) + lVar10 * 4);
          if ((int)uVar3 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf2,"int Abc_Lit2Var(int)");
          }
          pVVar6 = pAig->vObjs;
          if (pVVar6 == (Vec_Ptr_t *)0x0) {
            pvVar9 = (void *)0x0;
          }
          else {
            if (pVVar6->nSize <= (int)(uVar3 >> 1)) goto LAB_0065d54c;
            pvVar9 = pVVar6->pArray[uVar3 >> 1];
          }
          if (((ulong)pvVar9 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                          ,0x13e,"Aig_Obj_t *Aig_ObjCopy(Aig_Obj_t *)");
          }
          pAVar5 = Aig_And(p,pAVar5,(Aig_Obj_t *)
                                    ((ulong)(uVar3 & 1) ^ *(ulong *)((long)pvVar9 + 0x28)));
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(int *)((long)pvVar1 + 4));
      }
      Aig_ObjCreateCo(p,pAVar5);
      lVar12 = lVar12 + 1;
    } while (lVar12 < __ptr->nSize);
  }
  if (0 < pAig->nRegs) {
    iVar11 = 0;
    do {
      uVar3 = pAig->nTruePos + iVar11;
      if (((int)uVar3 < 0) || (pAig->vCos->nSize <= (int)uVar3)) {
LAB_0065d54c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pAig->vCos->pArray[uVar3];
      if (((ulong)pvVar1 & 1) != 0) {
LAB_0065d56b:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar7 = *(ulong *)((long)pvVar1 + 8);
      uVar8 = uVar7 & 0xfffffffffffffffe;
      if (uVar8 == 0) {
        pAVar5 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar5 = (Aig_Obj_t *)((ulong)((uint)uVar7 & 1) ^ *(ulong *)(uVar8 + 0x28));
      }
      Aig_ObjCreateCo(p,pAVar5);
      iVar11 = iVar11 + 1;
    } while (iVar11 < pAig->nRegs);
  }
  Aig_ManCleanup(p);
  Aig_ManSetRegNum(p,pAig->nRegs);
  if (__ptr != (Vec_Ptr_t *)0x0) {
    iVar11 = __ptr->nSize;
    if (0 < (long)iVar11) {
      ppvVar2 = __ptr->pArray;
      lVar12 = 0;
      do {
        pvVar1 = ppvVar2[lVar12];
        if (pvVar1 != (void *)0x0) {
          if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar1 + 8));
            *(undefined8 *)((long)pvVar1 + 8) = 0;
          }
          free(pvVar1);
        }
        lVar12 = lVar12 + 1;
      } while (iVar11 != lVar12);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    free(__ptr);
  }
  return p;
}

Assistant:

Aig_Man_t * Saig_ManDecPropertyOutput( Aig_Man_t * pAig, int nLits, int fVerbose )
{
    Aig_Man_t * pAigNew = NULL;
    Aig_Obj_t * pObj, * pMiter;
    Vec_Ptr_t * vPrimes;
    Vec_Int_t * vCube;
    int i, k, Lit;

    // compute primes of the comb output function
    vPrimes = Saig_ManFindPrimes( pAig, nLits, fVerbose );

    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    pAigNew->nConstrs = pAig->nConstrs;
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create original POs of the circuit
    Saig_ManForEachPo( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    // create prime POs of the circuit
    if ( vPrimes )
    Vec_PtrForEachEntry( Vec_Int_t *, vPrimes, vCube, k )
    {
        pMiter = Aig_ManConst1( pAigNew );
        Vec_IntForEachEntry( vCube, Lit, i )
        {
            pObj = Aig_NotCond( Aig_ObjCopy(Aig_ManObj(pAig, Abc_Lit2Var(Lit))), Abc_LitIsCompl(Lit) );
            pMiter = Aig_And( pAigNew, pMiter, pObj );
        }
        Aig_ObjCreateCo( pAigNew, pMiter );
    }
    // transfer to register outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManCleanup( pAigNew );
    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );

    Vec_VecFreeP( (Vec_Vec_t **)&vPrimes );
    return pAigNew;
}